

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servnotf.cpp
# Opt level: O0

void __thiscall
icu_63::ICUNotifier::removeListener(ICUNotifier *this,EventListener *l,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  EventListener *pEVar3;
  EventListener *el;
  int32_t local_2c;
  int e;
  int i;
  Mutex lmx;
  UErrorCode *status_local;
  EventListener *l_local;
  ICUNotifier *this_local;
  
  lmx.fMutex = (UMutex *)status;
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    if (l == (EventListener *)0x0) {
      ((lmx.fMutex)->fMutex).__data.__lock = 1;
    }
    else {
      Mutex::Mutex((Mutex *)&e,(UMutex *)notifyLock);
      if (this->listeners != (UVector *)0x0) {
        local_2c = 0;
        iVar2 = UVector::size(this->listeners);
        for (; local_2c < iVar2; local_2c = local_2c + 1) {
          pEVar3 = (EventListener *)UVector::elementAt(this->listeners,local_2c);
          if (l == pEVar3) {
            UVector::removeElementAt(this->listeners,local_2c);
            iVar2 = UVector::size(this->listeners);
            if (iVar2 == 0) {
              if (this->listeners != (UVector *)0x0) {
                (*(this->listeners->super_UObject)._vptr_UObject[1])();
              }
              this->listeners = (UVector *)0x0;
            }
            break;
          }
        }
      }
      Mutex::~Mutex((Mutex *)&e);
    }
  }
  return;
}

Assistant:

void 
ICUNotifier::removeListener(const EventListener *l, UErrorCode& status) 
{
    if (U_SUCCESS(status)) {
        if (l == NULL) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }

        {
            Mutex lmx(&notifyLock);
            if (listeners != NULL) {
                // identity equality check
                for (int i = 0, e = listeners->size(); i < e; ++i) {
                    const EventListener* el = (const EventListener*)listeners->elementAt(i);
                    if (l == el) {
                        listeners->removeElementAt(i);
                        if (listeners->size() == 0) {
                            delete listeners;
                            listeners = NULL;
                        }
                        return;
                    }
                }
            }
        }
    }
}